

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::computeQuadTexCoords
               (vector<float,_std::allocator<float>_> *texCoord,TextureImageIterator *iteration)

{
  int layerNdx;
  deUint32 dVar1;
  CubeFace face;
  Vec3 local_30;
  Vec3 local_20;
  IVec3 local_14;
  
  layerNdx = iteration->m_currentImage;
  dVar1 = (iteration->m_info).m_target;
  if (dVar1 == 0x8c1a) {
    local_20.m_data[0] = 0.0;
    local_20.m_data[1] = 0.0;
    local_30.m_data[0] = 1.0;
    local_30.m_data[1] = 1.0;
    glu::TextureTestUtil::computeQuadTexCoord2DArray
              (texCoord,layerNdx,(Vec2 *)&local_20,(Vec2 *)&local_30);
  }
  else if (dVar1 == 0x806f) {
    local_30.m_data[2] = ((float)layerNdx + 0.5) / (float)iteration->m_levelImageCount;
    local_20.m_data[0] = 0.0;
    local_20.m_data[1] = 0.0;
    local_30.m_data[0] = 1.0;
    local_30.m_data[1] = 1.0;
    local_14.m_data[0] = 0;
    local_14.m_data[1] = 1;
    local_14.m_data[2] = 2;
    local_20.m_data[2] = local_30.m_data[2];
    glu::TextureTestUtil::computeQuadTexCoord3D(texCoord,&local_20,&local_30,&local_14);
  }
  else {
    if (dVar1 == 0x8513) {
      face = glu::getCubeFaceFromGL((&DAT_018d9380)[layerNdx]);
      glu::TextureTestUtil::computeQuadTexCoordCube(texCoord,face);
      return;
    }
    if (dVar1 == 0xde1) {
      local_20.m_data[0] = 0.0;
      local_20.m_data[1] = 0.0;
      local_30.m_data[0] = 1.0;
      local_30.m_data[1] = 1.0;
      glu::TextureTestUtil::computeQuadTexCoord2D(texCoord,(Vec2 *)&local_20,(Vec2 *)&local_30);
    }
  }
  return;
}

Assistant:

void computeQuadTexCoords(vector<float>& texCoord, const TextureImageIterator& iteration)
{
	const int currentImage = iteration.getCurrentImage();
	switch (iteration.getTarget())
	{
		case GL_TEXTURE_2D:
			computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));
			break;

		case GL_TEXTURE_3D:
		{
			const float r = (float(currentImage) + 0.5f) / (float)iteration.getLevelImageCount();
			computeQuadTexCoord3D(texCoord, tcu::Vec3(0.0f, 0.0f, r), tcu::Vec3(1.0f, 1.0f, r), tcu::IVec3(0, 1, 2));
			break;
		}

		case GL_TEXTURE_CUBE_MAP:
			computeQuadTexCoordCube(texCoord, glu::getCubeFaceFromGL(mapFaceNdxToFace(currentImage)));
			break;

		case GL_TEXTURE_2D_ARRAY:
			computeQuadTexCoord2DArray(texCoord, currentImage, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));
			break;

		default:
			DE_FATAL("Unsupported texture target");
	}
}